

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O0

char * ktxSupercompressionSchemeString(ktxSupercmpScheme scheme)

{
  ktxSupercmpScheme scheme_local;
  char *local_8;
  
  switch(scheme) {
  case KTX_SS_BEGIN_RANGE:
    local_8 = "KTX_SS_NONE";
    break;
  case KTX_SS_BASIS_LZ:
    local_8 = "KTX_SS_BASIS_LZ";
    break;
  case KTX_SS_ZSTD:
    local_8 = "KTX_SS_ZSTD";
    break;
  case KTX_SS_END_RANGE:
    local_8 = "KTX_SS_ZLIB";
    break;
  default:
    if ((scheme < KTX_SS_BEGIN_VENDOR_RANGE) || (KTX_SS_END_VENDOR_RANGE < scheme)) {
      local_8 = "Invalid scheme value";
    }
    else {
      local_8 = "Vendor or reserved scheme";
    }
  }
  return local_8;
}

Assistant:

const char *
ktxSupercompressionSchemeString(ktxSupercmpScheme scheme)
{
    switch (scheme) {
      case KTX_SS_NONE: return "KTX_SS_NONE";
      case KTX_SS_BASIS_LZ: return "KTX_SS_BASIS_LZ";
      case KTX_SS_ZSTD: return "KTX_SS_ZSTD";
      case KTX_SS_ZLIB: return "KTX_SS_ZLIB";
      default:
        if (scheme < KTX_SS_BEGIN_VENDOR_RANGE
            || scheme >= KTX_SS_BEGIN_RESERVED)
            return "Invalid scheme value";
        else
            return "Vendor or reserved scheme";
    }
}